

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

size_t CCharmapToLocal::source_esc_cb(wchar_t ch,char **dest,size_t *len)

{
  ulong *in_RDX;
  long *in_RSI;
  uint in_EDI;
  size_t copylen;
  char buf [7];
  size_t local_28;
  char local_1f [7];
  ulong *local_18;
  long *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  sprintf(local_1f,"\\u%04x",(ulong)in_EDI);
  local_28 = 6;
  if (*local_18 < 6) {
    local_28 = *local_18;
  }
  memcpy((void *)*local_10,local_1f,local_28);
  *local_10 = local_28 + *local_10;
  *local_18 = *local_18 - local_28;
  return 6;
}

Assistant:

size_t CCharmapToLocal::source_esc_cb(wchar_t ch, char **dest, size_t *len)
{
    char buf[7];
    size_t copylen;
    
    /* prepare our own representation */
    sprintf(buf, "\\u%04x", (unsigned int)ch);

    /* copy the whole thing if possible, but limit to the available space */
    copylen = 6;
    if (copylen > *len)
        copylen = *len;

    /* copy the bytes */
    memcpy(*dest, buf, copylen);

    /* advance the buffer pointers */
    *dest += copylen;
    *len -= copylen;

    /* return the full space needed */
    return 6;
}